

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_hashmap.h
# Opt level: O3

void __thiscall
v_hashmap<unsigned_long,_features>::double_size(v_hashmap<unsigned_long,_features> *this)

{
  uint64_t uVar1;
  size_t sVar2;
  long lVar3;
  v_array<v_hashmap<unsigned_long,_features>::hash_elem> *__range2;
  hash_elem *phVar4;
  hash_elem *phVar5;
  features *pfVar6;
  features *pfVar7;
  hash_elem *e;
  hash_elem *phVar8;
  byte bVar9;
  v_array<v_hashmap<unsigned_long,_features>::hash_elem> local_48;
  
  bVar9 = 0;
  local_48.end_array = (hash_elem *)0x0;
  local_48.erase_count = 0;
  local_48._begin = (hash_elem *)0x0;
  local_48._end = (hash_elem *)0x0;
  v_array<v_hashmap<unsigned_long,_features>::hash_elem>::resize(&local_48,this->num_occupants + 10)
  ;
  phVar5 = (this->dat)._begin;
  phVar4 = (this->dat).end_array;
  phVar8 = phVar5;
  if (phVar5 != phVar4) {
    do {
      if (phVar5->occupied == true) {
        v_array<v_hashmap<unsigned_long,_features>::hash_elem>::push_back(&local_48,phVar5);
        phVar4 = (this->dat).end_array;
      }
      phVar5 = phVar5 + 1;
    } while (phVar5 != phVar4);
    phVar5 = phVar4;
    phVar8 = (this->dat)._begin;
  }
  v_array<v_hashmap<unsigned_long,_features>::hash_elem>::resize
            (&this->dat,(long)phVar5 - (long)phVar8 >> 6);
  phVar5 = (this->dat)._begin;
  memset(phVar5,0,(long)(this->dat).end_array - (long)phVar5);
  phVar4 = local_48._end;
  for (phVar5 = local_48._begin; phVar5 != phVar4; phVar5 = phVar5 + 1) {
    get(this,&phVar5->key,phVar5->hash);
    uVar1 = phVar5->hash;
    (this->dat)._begin[this->last_position].occupied = true;
    (this->dat)._begin[this->last_position].key = phVar5->key;
    phVar8 = (this->dat)._begin;
    sVar2 = this->last_position;
    phVar8[sVar2].val.sum_feat_sq = (phVar5->val).sum_feat_sq;
    pfVar6 = &phVar5->val;
    pfVar7 = &phVar8[sVar2].val;
    for (lVar3 = 0xc; lVar3 != 0; lVar3 = lVar3 + -1) {
      (pfVar7->values)._begin = (pfVar6->values)._begin;
      pfVar6 = (features *)((long)pfVar6 + (ulong)bVar9 * -0x10 + 8);
      pfVar7 = (features *)((long)pfVar7 + ((ulong)bVar9 * -2 + 1) * 8);
    }
    (this->dat)._begin[this->last_position].hash = uVar1;
  }
  if (local_48._begin != (hash_elem *)0x0) {
    free(local_48._begin);
  }
  return;
}

Assistant:

void double_size()
  {  //    printf("doubling size!\n");
    // remember the old occupants
    v_array<hash_elem> tmp = v_array<hash_elem>();
    tmp.resize(num_occupants + 10);
    for (hash_elem* e = dat.begin(); e != dat.end_array; e++)
      if (e->occupied)
        tmp.push_back(*e);

    // double the size and clear
    // std::cerr<<"doubling to "<<(base_size()*2) << " units == " << (base_size()*2*sizeof(hash_elem)) << " bytes / " <<
    // ((size_t)-1)<<std::endl;
    dat.resize(base_size() * 2);
    memset(dat.begin(), 0, base_size() * sizeof(hash_elem));

    // re-insert occupants
    for (auto& e : tmp)
    {
      get(e.key, e.hash);
      //      std::cerr << "reinserting " << e->key << " at " << last_position << std::endl;
      put_after_get_nogrow(e.key, e.hash, e.val);
    }
    tmp.delete_v();
  }